

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sweep_context.cc
# Opt level: O0

void __thiscall p2t::SweepContext::MapTriangleToNodes(SweepContext *this,Triangle *t)

{
  AdvancingFront *this_00;
  Triangle *pTVar1;
  Point *pPVar2;
  Node *pNVar3;
  Node *n;
  int i;
  Triangle *t_local;
  SweepContext *this_local;
  
  for (n._4_4_ = 0; n._4_4_ < 3; n._4_4_ = n._4_4_ + 1) {
    pTVar1 = Triangle::GetNeighbor(t,n._4_4_);
    if (pTVar1 == (Triangle *)0x0) {
      this_00 = this->front_;
      pPVar2 = Triangle::GetPoint(t,n._4_4_);
      pPVar2 = Triangle::PointCW(t,pPVar2);
      pNVar3 = AdvancingFront::LocatePoint(this_00,pPVar2);
      if (pNVar3 != (Node *)0x0) {
        pNVar3->triangle = t;
      }
    }
  }
  return;
}

Assistant:

void SweepContext::MapTriangleToNodes(Triangle& t)
{
  for (int i = 0; i < 3; i++) {
    if (!t.GetNeighbor(i)) {
      Node* n = front_->LocatePoint(t.PointCW(*t.GetPoint(i)));
      if (n)
        n->triangle = &t;
    }
  }
}